

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O3

int __thiscall
ON_Extrusion::GetProfileKinkParameters
          (ON_Extrusion *this,int profile_index,ON_SimpleArray<double> *profile_kink_parameters_ptr)

{
  bool bVar1;
  int iVar2;
  ON_Curve *this_00;
  int iVar3;
  double t0;
  double t;
  double t1;
  double local_38;
  double local_30;
  double local_28;
  
  this_00 = Profile(this,profile_index);
  if (this_00 == (ON_Curve *)0x0) {
    iVar3 = 0;
  }
  else {
    local_38 = -1.23432101234321e+308;
    local_28 = -1.23432101234321e+308;
    bVar1 = ON_Curve::GetDomain(this_00,&local_38,&local_28);
    iVar3 = 0;
    if (((bVar1) && (bVar1 = ON_IsValid(local_38), iVar3 = 0, bVar1)) && (local_38 < local_28)) {
      iVar3 = 0;
      iVar2 = (*(this_00->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x36])
                        (local_38,local_28,0x3feffec097f5af8a,0x3e500000000002c4,this_00,0xc,
                         &local_30,0,0);
      if ((char)iVar2 != '\0') {
        iVar3 = 0;
        do {
          if ((local_38 < local_30) && (local_30 < local_28)) {
            if (profile_kink_parameters_ptr != (ON_SimpleArray<double> *)0x0) {
              ON_SimpleArray<double>::Append(profile_kink_parameters_ptr,&local_30);
            }
            local_38 = local_30;
            iVar3 = iVar3 + 1;
          }
          iVar2 = (*(this_00->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x36])
                            (local_38,local_28,0x3feffec097f5af8a,0x3e500000000002c4,this_00,0xc,
                             &local_30,0,0);
        } while ((char)iVar2 != '\0');
      }
    }
  }
  return iVar3;
}

Assistant:

int ON_Extrusion::GetProfileKinkParameters( int profile_index, ON_SimpleArray<double>* profile_kink_parameters_ptr ) const
{
  const ON_Curve* profile2d = Profile(profile_index);
  if ( 0 == profile2d )
    return 0;
  double t0 = ON_UNSET_VALUE;
  double t1 = ON_UNSET_VALUE;
  double t;
  if ( !profile2d->GetDomain(&t0,&t1) )
    return 0;
  if ( !ON_IsValid(t0) || !(t0 < t1) )
    return 0;
  int count = 0;
  while ( GetNextProfileSegmentDiscontinuity( profile2d, t0,t1, &t) )
  {
    if ( t0 < t && t < t1 )
    {
      if ( nullptr != profile_kink_parameters_ptr )
      {
        profile_kink_parameters_ptr->Append(t);
      }
      t0 = t;
      count++;
    }
  }
  return count;
}